

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O1

deUint32 deqp::egl::anon_unknown_0::createGLES2Program(Functions *gl,TestLog *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLenum GVar6;
  TestError *this;
  deInt32 fragmentCompileStatus;
  deInt32 vertexCompileStatus;
  deInt32 linkStatus;
  deInt32 infoLogLength;
  string programInfoLog;
  string fragmentInfoLog;
  string vertexInfoLog;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  int local_124;
  int local_120;
  int local_11c;
  TestLog *local_118;
  string local_110;
  LogShader local_f0;
  GLchar *local_a0;
  undefined8 local_98;
  GLchar local_90;
  undefined7 uStack_8f;
  string local_80;
  string local_60;
  char *local_40;
  char *local_38;
  
  local_38 = 
  "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}";
  local_40 = "void main (void)\n{\n\tgl_FragColor = vec4(1.0);\n}";
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = '\0';
  local_118 = log;
  GVar3 = (*gl->createProgram)();
  GVar4 = (*gl->createShader)(0x8b31);
  GVar5 = (*gl->createShader)(0x8b30);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to create shaders and program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x79);
  (*gl->shaderSource)(GVar4,1,&local_38,(GLint *)0x0);
  (*gl->compileShader)(GVar4);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to setup vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x7d);
  (*gl->shaderSource)(GVar5,1,&local_40,(GLint *)0x0);
  (*gl->compileShader)(GVar5);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to setup fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x81);
  local_f0.m_type = QP_SHADER_TYPE_VERTEX;
  (*gl->getShaderiv)(GVar4,0x8b81,&local_120);
  (*gl->getShaderiv)(GVar4,0x8b84,(GLint *)&local_f0);
  std::__cxx11::string::resize((ulong)&local_60,(char)local_f0.m_type);
  (*gl->getShaderInfoLog)
            (GVar4,(GLsizei)local_60._M_string_length,(GLsizei *)&local_f0,local_60._M_dataplus._M_p
            );
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to get vertex shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x8c);
  std::__cxx11::string::resize((ulong)&local_60,(char)local_f0.m_type);
  local_f0.m_type = QP_SHADER_TYPE_VERTEX;
  (*gl->getShaderiv)(GVar5,0x8b81,&local_124);
  (*gl->getShaderiv)(GVar5,0x8b84,(GLint *)&local_f0);
  std::__cxx11::string::resize((ulong)&local_80,(char)local_f0.m_type);
  (*gl->getShaderInfoLog)
            (GVar5,(GLsizei)local_80._M_string_length,(GLsizei *)&local_f0,local_80._M_dataplus._M_p
            );
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to get fragment shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x9a);
  std::__cxx11::string::resize((ulong)&local_80,(char)local_f0.m_type);
  (*gl->attachShader)(GVar3,GVar4);
  (*gl->attachShader)(GVar3,GVar5);
  (*gl->linkProgram)(GVar3);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xa2);
  local_f0.m_type = QP_SHADER_TYPE_VERTEX;
  (*gl->getProgramiv)(GVar3,0x8b82,&local_11c);
  (*gl->getProgramiv)(GVar3,0x8b84,(GLint *)&local_f0);
  std::__cxx11::string::resize((ulong)&local_a0,(char)local_f0.m_type);
  (*gl->getProgramInfoLog)(GVar3,(GLsizei)local_98,(GLsizei *)&local_f0,local_a0);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to get program link info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xad);
  std::__cxx11::string::resize((ulong)&local_a0,(char)local_f0.m_type);
  if (((local_11c == 0) || (local_120 == 0)) || (local_124 == 0)) {
    tcu::TestLog::startShaderProgram(local_118,local_11c != 0,local_a0);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
               ,"");
    tcu::LogShader::LogShader(&local_f0,QP_SHADER_TYPE_VERTEX,&local_110,local_120 != 0,&local_60);
    tcu::TestLog::writeShader
              (local_118,local_f0.m_type,local_f0.m_source._M_dataplus._M_p,local_f0.m_compileOk,
               local_f0.m_infoLog._M_dataplus._M_p);
    paVar1 = &local_f0.m_infoLog.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_infoLog._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.m_infoLog._M_dataplus._M_p,
                      local_f0.m_infoLog.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_f0.m_source.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_source._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0.m_source._M_dataplus._M_p,
                      local_f0.m_source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"void main (void)\n{\n\tgl_FragColor = vec4(1.0);\n}","");
    tcu::LogShader::LogShader(&local_f0,QP_SHADER_TYPE_FRAGMENT,&local_110,local_124 != 0,&local_80)
    ;
    tcu::TestLog::writeShader
              (local_118,local_f0.m_type,local_f0.m_source._M_dataplus._M_p,local_f0.m_compileOk,
               local_f0.m_infoLog._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_infoLog._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.m_infoLog._M_dataplus._M_p,
                      local_f0.m_infoLog.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_source._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0.m_source._M_dataplus._M_p,
                      local_f0.m_source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endShaderProgram(local_118);
  }
  (*gl->deleteShader)(GVar4);
  (*gl->deleteShader)(GVar5);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to delete shaders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xbf);
  if (((local_11c != 0) && (local_120 != 0)) && (local_124 != 0)) {
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    return GVar3;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,
             "linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
             ,0xc1);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

deUint32 createGLES2Program (const glw::Functions& gl, TestLog& log)
{
	const char* const vertexShaderSource =
	"attribute highp vec2 a_pos;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}";

	const char* const fragmentShaderSource =
	"uniform mediump vec4 u_color;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = u_color;\n"
	"}";

	deUint32	program			= 0;
	deUint32	vertexShader	= 0;
	deUint32	fragmentShader	= 0;

	deInt32		vertexCompileStatus;
	string		vertexInfoLog;
	deInt32		fragmentCompileStatus;
	string		fragmentInfoLog;
	deInt32		linkStatus;
	string		programInfoLog;

	try
	{
		program			= gl.createProgram();
		vertexShader	= gl.createShader(GL_VERTEX_SHADER);
		fragmentShader	= gl.createShader(GL_FRAGMENT_SHADER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create shaders and program");

		gl.shaderSource(vertexShader, 1, &vertexShaderSource, DE_NULL);
		gl.compileShader(vertexShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup vertex shader");

		gl.shaderSource(fragmentShader, 1, &fragmentShaderSource, DE_NULL);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup fragment shader");

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(vertexShader, GL_COMPILE_STATUS, &vertexCompileStatus);
			gl.getShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			vertexInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(vertexShader, (glw::GLsizei)vertexInfoLog.length(), &infoLogLength, &(vertexInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get vertex shader compile info");

			vertexInfoLog.resize(infoLogLength);
		}

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(fragmentShader, GL_COMPILE_STATUS, &fragmentCompileStatus);
			gl.getShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			fragmentInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(fragmentShader, (glw::GLsizei)fragmentInfoLog.length(), &infoLogLength, &(fragmentInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get fragment shader compile info");

			fragmentInfoLog.resize(infoLogLength);
		}

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup program");

		{
			deInt32		infoLogLength = 0;

			gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);
			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLength);

			programInfoLog.resize(infoLogLength, '\0');

			gl.getProgramInfoLog(program, (glw::GLsizei)programInfoLog.length(), &infoLogLength, &(programInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get program link info");

			programInfoLog.resize(infoLogLength);
		}

		if (linkStatus == 0 || vertexCompileStatus == 0 || fragmentCompileStatus == 0)
		{

			log.startShaderProgram(linkStatus != 0, programInfoLog.c_str());

			log << TestLog::Shader(QP_SHADER_TYPE_VERTEX, vertexShaderSource, vertexCompileStatus != 0, vertexInfoLog);
			log << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, fragmentShaderSource, fragmentCompileStatus != 0, fragmentInfoLog);

			log.endShaderProgram();
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete shaders");

		TCU_CHECK(linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0);
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		if (vertexShader)
			gl.deleteShader(vertexShader);

		if (fragmentShader)
			gl.deleteShader(fragmentShader);

		throw;
	}

	return program;
}